

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O3

Type * __thiscall
psy::C::TypeChecker::typeOfStringLiteral(TypeChecker *this,EncodingPrefix encodingSuffix)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  
  switch(CONCAT71(in_register_00000031,encodingSuffix) & 0xffffffff) {
  case 0:
    return this->u8StrLitTy_;
  case 1:
    return this->uStrLitTy_;
  case 2:
    return this->UStrLitTy_;
  case 3:
    return this->LStrLitTy_;
  case 4:
    return this->strLitTy_;
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x380);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<empty message>",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    return (Type *)0x0;
  }
}

Assistant:

const Type* TypeChecker::typeOfStringLiteral(StringLiteral::EncodingPrefix encodingSuffix)
{
    switch (encodingSuffix) {
        case StringLiteral::EncodingPrefix::None:
            return strLitTy_;
        case StringLiteral::EncodingPrefix::u8:
            return u8StrLitTy_;
        case StringLiteral::EncodingPrefix::u:
            return uStrLitTy_;
        case StringLiteral::EncodingPrefix::U:
            return UStrLitTy_;
        case StringLiteral::EncodingPrefix::L:
            return LStrLitTy_;
        default:
            PSY_ASSERT_1(false);
            return nullptr;
    }
}